

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceSyncTest_TestNotEqualsDifferent_Test::TestBody
          (PriceSyncTest_TestNotEqualsDifferent_Test *this)

{
  char *message;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78 [7];
  ByteBuffer buffer;
  
  PriceSyncTest::createBuffer((PriceSyncTest *)&buffer);
  bidfx_public_api::tools::ByteBuffer::SetByte((ulong)&buffer,'\x01');
  bidfx_public_api::price::pixie::PriceSync::PriceSync
            ((PriceSync *)local_78,&buffer,
             (this->super_PriceSyncTest).buffer_inflator.
             super___shared_ptr<bidfx_public_api::tools::BufferInflator,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  testing::internal::
  CmpHelperNE<bidfx_public_api::price::pixie::PriceSync,bidfx_public_api::price::pixie::PriceSync>
            ((internal *)&gtest_ar,"price_sync","PriceSync(buffer, *buffer_inflator)",
             &(this->super_PriceSyncTest).price_sync,(PriceSync *)local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_sync_test.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&buffer);
  return;
}

Assistant:

TEST_F(PriceSyncTest, TestNotEqualsDifferent)
{
    ByteBuffer buffer = createBuffer();
    buffer.SetByte(1, 33);
    EXPECT_NE(price_sync, PriceSync(buffer, *buffer_inflator));
}